

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLayeredFramebuffer.cpp
# Opt level: O1

IterateResult __thiscall
glcts::GeometryShaderLayeredFramebufferBlending::iterate
          (GeometryShaderLayeredFramebufferBlending *this)

{
  ostringstream *this_00;
  byte *pbVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  GLuint GVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  long lVar8;
  TestError *this_01;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  pointer_____offset_0x10___ *ppuVar13;
  uchar **ppuVar14;
  uchar *puVar15;
  float fVar16;
  float fVar17;
  float slice_rgba [4];
  char *gs_code;
  char *fs_code;
  uchar *slice_pixels_ptr_1 [4];
  uchar buffer_slice4 [64];
  uchar buffer_slice3 [64];
  uchar buffer_slice2 [64];
  uchar buffer_slice1 [64];
  uchar *slice_pixels_ptr [4];
  ios_base local_280 [264];
  uchar ref_buffer_slice4 [64];
  uchar ref_buffer_slice3 [64];
  uchar ref_buffer_slice2 [64];
  uchar ref_buffer_slice1 [64];
  uchar buffer [64];
  long lVar7;
  
  fs_code = 
  "${VERSION}\n\nprecision highp float;\n\nout vec4 result;\n\nvoid main()\n{\n    result = vec4(0.2);\n}\n"
  ;
  gs_code = 
  "${VERSION}\n${GEOMETRY_SHADER_REQUIRE}\n\nlayout(points)                          in;\nlayout(triangle_strip, max_vertices=64) out;\n\nvoid main()\n{\n    for (int n = 0; n < 4; ++n)\n    {\n        gl_Layer    = n;\n        gl_Position = vec4(1, 1, 0, 1);\n        EmitVertex();\n\n        gl_Layer    = n;\n        gl_Position = vec4(1, -1, 0, 1);\n        EmitVertex();\n\n        gl_Layer    = n;\n        gl_Position = vec4(-1, 1, 0, 1);\n        EmitVertex();\n\n        gl_Layer    = n;\n        gl_Position = vec4(-1, -1, 0, 1);\n        EmitVertex();\n\n        EndPrimitive();\n    }\n}\n"
  ;
  iVar4 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar4);
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported == false) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              ((NotSupportedError *)this_01,"Geometry shader functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
               ,0xb9);
    ppuVar13 = &tcu::NotSupportedError::typeinfo;
  }
  else {
    GVar5 = (**(code **)(lVar7 + 0x3f0))(0x8b30);
    this->m_fs_id = GVar5;
    GVar5 = (**(code **)(lVar7 + 0x3f0))((this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER);
    this->m_gs_id = GVar5;
    GVar5 = (**(code **)(lVar7 + 0x3f0))(0x8b31);
    this->m_vs_id = GVar5;
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"Could not generate shader objects",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
                    ,0xc1);
    GVar5 = (**(code **)(lVar7 + 0x3c8))();
    this->m_po_id = GVar5;
    bVar3 = TestCaseBase::buildProgram
                      (&this->super_TestCaseBase,GVar5,this->m_fs_id,1,&fs_code,this->m_gs_id,1,
                       &gs_code,this->m_vs_id,1,&TestCaseBase::m_boilerplate_vs_code,(bool *)0x0);
    if (bVar3) {
      lVar8 = 0;
      do {
        slice_pixels_ptr[0] = buffer_slice1 + lVar8 * 4;
        slice_pixels_ptr[1] = buffer_slice2 + lVar8 * 4;
        slice_pixels_ptr[2] = buffer_slice3 + lVar8 * 4;
        slice_pixels_ptr[3] = buffer_slice4 + lVar8 * 4;
        uVar11 = 0;
        ppuVar14 = slice_pixels_ptr;
        do {
          puVar15 = *ppuVar14;
          *puVar15 = '\0';
          puVar15[1] = (uchar)(uVar11 >> 2);
          puVar15[2] = (uchar)(uVar11 >> 3);
          puVar15[3] = (uchar)((uVar11 & 0xffffffff) / 0xc);
          ppuVar14 = ppuVar14 + 1;
          uVar11 = uVar11 + 0xff;
        } while (uVar11 != 0x3fc);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x10);
      lVar8 = 0;
      do {
        slice_pixels_ptr[0] = ref_buffer_slice1 + lVar8 * 4;
        slice_pixels_ptr[1] = ref_buffer_slice2 + lVar8 * 4;
        slice_pixels_ptr[2] = ref_buffer_slice3 + lVar8 * 4;
        slice_pixels_ptr[3] = ref_buffer_slice4 + lVar8 * 4;
        slice_pixels_ptr_1[0] = buffer_slice1 + lVar8 * 4;
        slice_pixels_ptr_1[1] = buffer_slice2 + lVar8 * 4;
        slice_pixels_ptr_1[2] = buffer_slice3 + lVar8 * 4;
        slice_pixels_ptr_1[3] = buffer_slice4 + lVar8 * 4;
        lVar10 = 0;
        do {
          pbVar1 = slice_pixels_ptr_1[lVar10];
          slice_rgba[0] = (float)*pbVar1 / 255.0;
          slice_rgba[1] = (float)pbVar1[1] / 255.0;
          slice_rgba[2] = (float)pbVar1[2] / 255.0;
          puVar15 = slice_pixels_ptr[lVar10];
          slice_rgba[3] = (float)pbVar1[3] / 255.0;
          lVar12 = 0;
          do {
            fVar16 = slice_rgba[lVar12] * slice_rgba[lVar12] + 0.16000001;
            fVar17 = 1.0;
            if (fVar16 <= 1.0) {
              fVar17 = fVar16;
            }
            puVar15[lVar12] = (uchar)(int)(fVar17 * 255.0);
            lVar12 = lVar12 + 1;
          } while (lVar12 != 4);
          lVar10 = lVar10 + 1;
        } while (lVar10 != 4);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x10);
      (**(code **)(lVar7 + 0x6f8))(1);
      (**(code **)(lVar7 + 0xb8))(0x806f,this->m_to_id);
      (**(code **)(lVar7 + 0x1398))(0x806f,1,0x8058,4,4,4);
      (**(code **)(lVar7 + 0x13c0))(0x806f,0,0,0,0,4,4,1,0x1908,0x1401,buffer_slice1);
      (**(code **)(lVar7 + 0x13c0))(0x806f,0,0,0,1,4,4,1,0x1908,0x1401,buffer_slice2);
      (**(code **)(lVar7 + 0x13c0))(0x806f,0,0,0,2,4,4,1,0x1908,0x1401,buffer_slice3);
      (**(code **)(lVar7 + 0x13c0))(0x806f,0,0,0,3,4,4,1,0x1908,0x1401,buffer_slice4);
      dVar6 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar6,"Could not set up texture object",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
                      ,0x117);
      (**(code **)(lVar7 + 0x6d0))(1,&this->m_fbo_id);
      (**(code **)(lVar7 + 0x78))(0x8ca9,this->m_fbo_id);
      (**(code **)(lVar7 + 0x690))(0x8ca9,0x8ce0,this->m_to_id,0);
      dVar6 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar6,"Could not set up draw framebuffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
                      ,0x11f);
      (**(code **)(lVar7 + 0x708))(1,&this->m_vao_id);
      (**(code **)(lVar7 + 0xd8))(this->m_vao_id);
      dVar6 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar6,"Could not set up vertex array object",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
                      ,0x125);
      (**(code **)(lVar7 + 0x120))(0x301,0x306);
      (**(code **)(lVar7 + 0x5e0))(0xbe2);
      (**(code **)(lVar7 + 0x1680))(this->m_po_id);
      (**(code **)(lVar7 + 0x1a00))(0,0,4,4);
      (**(code **)(lVar7 + 0x538))(0,0,1);
      dVar6 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar6,"Draw call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
                      ,0x131);
      (**(code **)(lVar7 + 0x6d0))(1,&this->m_read_fbo_id);
      (**(code **)(lVar7 + 0x78))(0x8ca8,this->m_read_fbo_id);
      lVar8 = 0;
      this_00 = (ostringstream *)(slice_pixels_ptr + 1);
      do {
        puVar15 = ref_buffer_slice4;
        if (lVar8 == 2) {
          puVar15 = ref_buffer_slice3;
        }
        if (lVar8 == 1) {
          puVar15 = ref_buffer_slice2;
        }
        if (lVar8 == 0) {
          puVar15 = ref_buffer_slice1;
        }
        lVar10 = 0;
        (**(code **)(lVar7 + 0x6b8))(0x8ca8,0x8ce0,this->m_to_id,0);
        (**(code **)(lVar7 + 0x1220))(0,0,4,4,0x1908,0x1401,buffer);
        dVar6 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar6,"Could not read back pixel data!",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
                        ,0x143);
        uVar11 = (ulong)puVar15 | 3;
        puVar15 = buffer + 3;
        bVar3 = false;
        do {
          lVar12 = 0;
          do {
            uVar9 = (uint)puVar15[lVar12 * 4 + -3] - (uint)*(byte *)((uVar11 - 3) + lVar12 * 4);
            uVar2 = -uVar9;
            if (0 < (int)uVar9) {
              uVar2 = uVar9;
            }
            if ((uVar2 & 0xff) < 2) {
              uVar9 = (uint)puVar15[lVar12 * 4 + -2] - (uint)*(byte *)((uVar11 - 2) + lVar12 * 4);
              uVar2 = -uVar9;
              if (0 < (int)uVar9) {
                uVar2 = uVar9;
              }
              if (1 < (uVar2 & 0xff)) goto LAB_00d05b62;
              uVar9 = (uint)puVar15[lVar12 * 4 + -1] - (uint)*(byte *)((uVar11 - 1) + lVar12 * 4);
              uVar2 = -uVar9;
              if (0 < (int)uVar9) {
                uVar2 = uVar9;
              }
              if (1 < (uVar2 & 0xff)) goto LAB_00d05b62;
              uVar9 = (uint)puVar15[lVar12 * 4] - (uint)*(byte *)(uVar11 + lVar12 * 4);
              uVar2 = -uVar9;
              if (0 < (int)uVar9) {
                uVar2 = uVar9;
              }
              if (1 < (uVar2 & 0xff)) goto LAB_00d05b62;
            }
            else {
LAB_00d05b62:
              slice_pixels_ptr[0] =
                   (uchar *)((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->
                            m_log;
              std::__cxx11::ostringstream::ostringstream(this_00);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"(layer=",7);
              std::ostream::_M_insert<unsigned_long>((ulong)this_00);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," x=",3);
              std::ostream::_M_insert<unsigned_long>((ulong)this_00);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," y=",3);
              std::ostream::_M_insert<unsigned_long>((ulong)this_00);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,") ",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this_00,
                         "Reference value is different than the rendered data (epsilon > ",0x3f);
              std::ostream::operator<<(this_00,1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"): ",3);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"(",1);
              std::ostream::_M_insert<unsigned_long>((ulong)this_00);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
              std::ostream::_M_insert<unsigned_long>((ulong)this_00);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
              std::ostream::_M_insert<unsigned_long>((ulong)this_00);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
              std::ostream::_M_insert<unsigned_long>((ulong)this_00);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,") vs ",5);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"(",1);
              std::ostream::_M_insert<unsigned_long>((ulong)this_00);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
              std::ostream::_M_insert<unsigned_long>((ulong)this_00);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
              std::ostream::_M_insert<unsigned_long>((ulong)this_00);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
              std::ostream::_M_insert<unsigned_long>((ulong)this_00);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,").",2);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)slice_pixels_ptr,
                         (EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(this_00);
              std::ios_base::~ios_base(local_280);
              bVar3 = true;
            }
            lVar12 = lVar12 + 1;
          } while (lVar12 != 4);
          lVar10 = lVar10 + 1;
          puVar15 = puVar15 + 4;
          uVar11 = uVar11 + 4;
        } while (lVar10 != 4);
        if (bVar3) {
          this_01 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_01,"Pixel data comparison failed",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
                     ,0x16a);
          goto LAB_00d05e03;
        }
        lVar8 = lVar8 + 1;
        if (lVar8 == 4) {
          tcu::TestContext::setTestResult
                    ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_PASS,"Pass");
          return STOP;
        }
      } while( true );
    }
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Could not build program object",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
               ,0xc9);
LAB_00d05e03:
    ppuVar13 = &tcu::TestError::typeinfo;
  }
  __cxa_throw(this_01,ppuVar13,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderLayeredFramebufferBlending::iterate(void)
{
/* Test-wide constants */
#define N_TEXTURE_COMPONENTS (4)
#define TEXTURE_DEPTH (4)
#define TEXTURE_HEIGHT (4)
#define TEXTURE_WIDTH (4)

	/* Fragment shader code */
	const char* fs_code = "${VERSION}\n"
						  "\n"
						  "precision highp float;\n"
						  "\n"
						  "out vec4 result;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    result = vec4(0.2);\n"
						  "}\n";

	/* Geometry shader code */
	const char* gs_code = "${VERSION}\n"
						  "${GEOMETRY_SHADER_REQUIRE}\n"
						  "\n"
						  "layout(points)                          in;\n"
						  "layout(triangle_strip, max_vertices=64) out;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    for (int n = 0; n < 4; ++n)\n"
						  "    {\n"
						  "        gl_Layer    = n;\n"
						  "        gl_Position = vec4(1, 1, 0, 1);\n"
						  "        EmitVertex();\n"
						  "\n"
						  "        gl_Layer    = n;\n"
						  "        gl_Position = vec4(1, -1, 0, 1);\n"
						  "        EmitVertex();\n"
						  "\n"
						  "        gl_Layer    = n;\n"
						  "        gl_Position = vec4(-1, 1, 0, 1);\n"
						  "        EmitVertex();\n"
						  "\n"
						  "        gl_Layer    = n;\n"
						  "        gl_Position = vec4(-1, -1, 0, 1);\n"
						  "        EmitVertex();\n"
						  "\n"
						  "        EndPrimitive();\n"
						  "    }\n"
						  "}\n";

	/* General variables */
	const glw::Functions& gl		  = m_context.getRenderContext().getFunctions();
	unsigned int		  n			  = 0;
	unsigned int		  n_component = 0;
	unsigned int		  n_layer	 = 0;
	unsigned int		  n_slice	 = 0;
	unsigned int		  x			  = 0;
	unsigned int		  y			  = 0;

	unsigned char buffer[TEXTURE_WIDTH * TEXTURE_HEIGHT * N_TEXTURE_COMPONENTS];
	unsigned char buffer_slice1[TEXTURE_WIDTH * TEXTURE_HEIGHT * N_TEXTURE_COMPONENTS];
	unsigned char buffer_slice2[TEXTURE_WIDTH * TEXTURE_HEIGHT * N_TEXTURE_COMPONENTS];
	unsigned char buffer_slice3[TEXTURE_WIDTH * TEXTURE_HEIGHT * N_TEXTURE_COMPONENTS];
	unsigned char buffer_slice4[TEXTURE_WIDTH * TEXTURE_HEIGHT * N_TEXTURE_COMPONENTS];
	unsigned char ref_buffer_slice1[TEXTURE_WIDTH * TEXTURE_HEIGHT * N_TEXTURE_COMPONENTS];
	unsigned char ref_buffer_slice2[TEXTURE_WIDTH * TEXTURE_HEIGHT * N_TEXTURE_COMPONENTS];
	unsigned char ref_buffer_slice3[TEXTURE_WIDTH * TEXTURE_HEIGHT * N_TEXTURE_COMPONENTS];
	unsigned char ref_buffer_slice4[TEXTURE_WIDTH * TEXTURE_HEIGHT * N_TEXTURE_COMPONENTS];

	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Set up shader objects */
	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_gs_id = gl.createShader(m_glExtTokens.GEOMETRY_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate shader objects");

	/* Set up program objects */
	m_po_id = gl.createProgram();

	if (!buildProgram(m_po_id, m_fs_id, 1 /* part */, &fs_code, m_gs_id, 1 /* part */, &gs_code, m_vs_id, 1 /* part */,
					  &m_boilerplate_vs_code))
	{
		TCU_FAIL("Could not build program object");
	}

	/* Prepare texture data we will use for each slice */
	for (n = 0; n < TEXTURE_WIDTH * TEXTURE_HEIGHT; ++n)
	{
		unsigned char* slice_pixels_ptr[] = { buffer_slice1 + n * N_TEXTURE_COMPONENTS,
											  buffer_slice2 + n * N_TEXTURE_COMPONENTS,
											  buffer_slice3 + n * N_TEXTURE_COMPONENTS,
											  buffer_slice4 + n * N_TEXTURE_COMPONENTS };

		for (n_slice = 0; n_slice < sizeof(slice_pixels_ptr) / sizeof(slice_pixels_ptr[0]); ++n_slice)
		{
			slice_pixels_ptr[n_slice][0] = 0;
			slice_pixels_ptr[n_slice][1] = (unsigned char)(n_slice * 255 / 4);
			slice_pixels_ptr[n_slice][2] = (unsigned char)(n_slice * 255 / 8);
			slice_pixels_ptr[n_slice][3] = (unsigned char)(n_slice * 255 / 12);
		} /* for (all slices) */
	}	 /* for (all pixels) */

	/* Calculate reference texture data we will later use when verifying the rendered data */
	for (n = 0; n < TEXTURE_WIDTH * TEXTURE_HEIGHT; ++n)
	{
		unsigned char* ref_slice_pixels_ptr[] = { ref_buffer_slice1 + n * N_TEXTURE_COMPONENTS,
												  ref_buffer_slice2 + n * N_TEXTURE_COMPONENTS,
												  ref_buffer_slice3 + n * N_TEXTURE_COMPONENTS,
												  ref_buffer_slice4 + n * N_TEXTURE_COMPONENTS };

		unsigned char* slice_pixels_ptr[] = { buffer_slice1 + n * N_TEXTURE_COMPONENTS,
											  buffer_slice2 + n * N_TEXTURE_COMPONENTS,
											  buffer_slice3 + n * N_TEXTURE_COMPONENTS,
											  buffer_slice4 + n * N_TEXTURE_COMPONENTS };

		for (n_slice = 0; n_slice < sizeof(slice_pixels_ptr) / sizeof(slice_pixels_ptr[0]); ++n_slice)
		{
			unsigned char* ref_slice_ptr = ref_slice_pixels_ptr[n_slice];
			unsigned char* slice_ptr	 = slice_pixels_ptr[n_slice];
			float		   slice_rgba[]  = {
				float(slice_ptr[0]) / 255.0f, /* convert to FP representation */
				float(slice_ptr[1]) / 255.0f, /* convert to FP representation */
				float(slice_ptr[2]) / 255.0f, /* convert to FP representation */
				float(slice_ptr[3]) / 255.0f  /* convert to FP representation */
			};

			for (n_component = 0; n_component < N_TEXTURE_COMPONENTS; ++n_component)
			{
				float temp_component = slice_rgba[n_component] /* dst_color */ * slice_rgba[n_component] /* dst_color */
									   + 0.8f /* 1-src_color */ * 0.2f /* src_color */;

				/* Clamp if necessary */
				if (temp_component < 0)
				{
					temp_component = 0.0f;
				}
				else if (temp_component > 1)
				{
					temp_component = 1.0f;
				}

				/* Convert back to GL_RGBA8 */
				ref_slice_ptr[n_component] = (unsigned char)(temp_component * 255.0f);
			} /* for (all components) */
		}	 /* for (all slices) */
	}		  /* for (all pixels) */

	/* Set up texture object used for the test */
	gl.genTextures(1, &m_to_id);
	gl.bindTexture(GL_TEXTURE_3D, m_to_id);
	gl.texStorage3D(GL_TEXTURE_3D, 1 /* levels */, GL_RGBA8, TEXTURE_WIDTH, TEXTURE_HEIGHT, TEXTURE_DEPTH);
	gl.texSubImage3D(GL_TEXTURE_3D, 0 /* level */, 0 /* xoffset */, 0 /* yoffset */, 0 /* zoffset */, TEXTURE_WIDTH,
					 TEXTURE_HEIGHT, 1 /* depth */, GL_RGBA, GL_UNSIGNED_BYTE, buffer_slice1);
	gl.texSubImage3D(GL_TEXTURE_3D, 0 /* level */, 0 /* xoffset */, 0 /* yoffset */, 1 /* zoffset */, TEXTURE_WIDTH,
					 TEXTURE_HEIGHT, 1 /* depth */, GL_RGBA, GL_UNSIGNED_BYTE, buffer_slice2);
	gl.texSubImage3D(GL_TEXTURE_3D, 0 /* level */, 0 /* xoffset */, 0 /* yoffset */, 2 /* zoffset */, TEXTURE_WIDTH,
					 TEXTURE_HEIGHT, 1 /* depth */, GL_RGBA, GL_UNSIGNED_BYTE, buffer_slice3);
	gl.texSubImage3D(GL_TEXTURE_3D, 0 /* level */, 0 /* xoffset */, 0 /* yoffset */, 3 /* zoffset */, TEXTURE_WIDTH,
					 TEXTURE_HEIGHT, 1 /* depth */, GL_RGBA, GL_UNSIGNED_BYTE, buffer_slice4);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up texture object");

	/* Set up framebuffer object used for the test */
	gl.genFramebuffers(1, &m_fbo_id);
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, m_fbo_id);

	gl.framebufferTexture(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_to_id, 0 /* level */);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up draw framebuffer");

	/* Generate and bind a vertex array object */
	gl.genVertexArrays(1, &m_vao_id);
	gl.bindVertexArray(m_vao_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up vertex array object");

	/* Set up blending */
	gl.blendFunc(GL_ONE_MINUS_SRC_COLOR, GL_DST_COLOR);
	gl.enable(GL_BLEND);

	/* Render */
	gl.useProgram(m_po_id);
	gl.viewport(0 /* x */, 0 /* y */, TEXTURE_WIDTH, TEXTURE_HEIGHT);

	gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Draw call failed");

	/* Verify rendered data in the layers */
	gl.genFramebuffers(1, &m_read_fbo_id);
	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, m_read_fbo_id);

	for (n_layer = 0; n_layer < TEXTURE_DEPTH; ++n_layer)
	{
		bool has_layer_failed = false;

		const unsigned char* ref_buffer =
			(n_layer == 0) ?
				ref_buffer_slice1 :
				(n_layer == 1) ? ref_buffer_slice2 : (n_layer == 2) ? ref_buffer_slice3 : ref_buffer_slice4;

		gl.framebufferTextureLayer(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_to_id, 0 /* level */, n_layer);
		gl.readPixels(0 /* x */, 0 /* y */, TEXTURE_WIDTH, TEXTURE_HEIGHT, GL_RGBA, GL_UNSIGNED_BYTE, buffer);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not read back pixel data!");

		for (y = 0; y < TEXTURE_HEIGHT; ++y)
		{
			const unsigned int   pixel_size = N_TEXTURE_COMPONENTS;
			const unsigned char* ref_row	= ref_buffer + y * pixel_size;
			const unsigned char* row		= buffer + y * pixel_size;

			for (x = 0; x < TEXTURE_WIDTH; ++x)
			{
#define EPSILON (1)

				const unsigned char* data	 = row + x * pixel_size;
				const unsigned char* ref_data = ref_row + x * pixel_size;

				if (de::abs((int)data[0] - (int)ref_data[0]) > EPSILON ||
					de::abs((int)data[1] - (int)ref_data[1]) > EPSILON ||
					de::abs((int)data[2] - (int)ref_data[2]) > EPSILON ||
					de::abs((int)data[3] - (int)ref_data[3]) > EPSILON)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "(layer=" << n_layer << " x=" << x << " y=" << y
									   << ") "
									   << "Reference value is different than the rendered data (epsilon > " << EPSILON
									   << "): "
									   << "(" << (unsigned int)ref_data[0] << ", " << (unsigned int)ref_data[1] << ", "
									   << (unsigned int)ref_data[2] << ", " << (unsigned int)ref_data[3] << ") vs "
									   << "(" << (unsigned int)data[0] << ", " << (unsigned int)data[1] << ", "
									   << (unsigned int)data[2] << ", " << (unsigned int)data[3] << ")."
									   << tcu::TestLog::EndMessage;

					has_layer_failed = true;
				} /* if (regions are different) */

#undef EPSILON
			} /* for (all pixels in a row) */
		}	 /* for (all rows) */

		if (has_layer_failed)
		{
			TCU_FAIL("Pixel data comparison failed");
		}
	} /* for (all layers) */

	/* Done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;

#undef N_TEXTURE_COMPONENTS
#undef TEXTURE_DEPTH
#undef TEXTURE_HEIGHT
#undef TEXTURE_WIDTH
}